

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_d,bool reduce_c,
              bool post_process,float coeff,int keepdims,Option *opt)

{
  int iVar1;
  size_t sVar2;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  int *piVar6;
  bool bVar7;
  byte bVar8;
  char cVar9;
  int j_3;
  uint uVar10;
  uint uVar11;
  Mat *pMVar12;
  Mat *pMVar13;
  Mat *pMVar14;
  Mat *pMVar15;
  void *pvVar16;
  void *pvVar17;
  byte bVar18;
  long lVar19;
  Mat *pMVar20;
  void *pvVar21;
  Mat *pMVar22;
  void *pvVar23;
  byte bVar24;
  undefined7 in_register_00000011;
  Mat *pMVar25;
  void *pvVar26;
  int iVar27;
  uint uVar28;
  byte bVar29;
  char cVar30;
  Mat *pMVar31;
  Mat *pMVar32;
  size_t sVar33;
  Mat *pMVar34;
  uint uVar35;
  size_t sVar36;
  undefined7 in_register_00000089;
  ulong uVar37;
  bool *pbVar38;
  void *pvVar39;
  bool *pbVar40;
  int in_R10D;
  int j;
  ulong uVar41;
  long lVar42;
  int j_2;
  uint uVar43;
  ulong uVar44;
  uint uVar45;
  float *mins_ptr;
  float fVar46;
  undefined3 in_stack_00000009;
  undefined4 in_stack_00000014;
  int size_1;
  int size;
  Mat *local_a8;
  Mat local_88;
  size_t local_40;
  void *local_38;
  
  uVar37 = CONCAT71(in_register_00000089,reduce_c);
  uVar41 = CONCAT71(in_register_00000011,reduce_w);
  lVar19 = CONCAT44(in_stack_00000014,keepdims);
  pMVar31 = (Mat *)(ulong)_post_process;
  sVar2 = a->elemsize;
  iVar27 = a->dims;
  if (iVar27 == 2) {
    uVar10 = a->w;
    pMVar20 = (Mat *)(ulong)uVar10;
    uVar11 = a->h;
    pMVar12 = (Mat *)(ulong)uVar11;
    if (reduce_w && reduce_h) {
      if (_post_process == 0) {
        Mat::create(b,1,sVar2,*(Allocator **)(lVar19 + 8));
      }
      else {
        Mat::create(b,1,1,sVar2,*(Allocator **)(lVar19 + 8));
      }
      local_88.cstep = 0;
      local_88.data = (Mat *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      pMVar31 = (Mat *)(ulong)uVar11;
      Mat::create(&local_88,uVar11,sVar2,*(Allocator **)(lVar19 + 0x10));
      in_R10D = -100;
      if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        if ((int)uVar11 < 1) {
LAB_0033ab20:
          fVar46 = 0.0;
        }
        else {
          pvVar21 = a->data;
          iVar1 = a->w;
          sVar33 = a->elemsize;
          pMVar31 = (Mat *)0x0;
          do {
            fVar46 = 0.0;
            if (0 < (int)uVar10) {
              pMVar25 = (Mat *)0x0;
              do {
                fVar46 = fVar46 + ABS(*(float *)((long)pvVar21 + (long)pMVar25 * 4));
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar20 != pMVar25);
            }
            *(float *)((long)(void **)local_88.data + (long)pMVar31 * 4) = fVar46;
            pMVar31 = (Mat *)((long)&pMVar31->data + 1);
            pvVar21 = (void *)((long)pvVar21 + (long)iVar1 * sVar33);
          } while (pMVar31 != pMVar12);
          if ((int)uVar11 < 1) goto LAB_0033ab20;
          fVar46 = 0.0;
          pMVar20 = (Mat *)0x0;
          do {
            fVar46 = fVar46 + *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4);
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          } while (pMVar12 != pMVar20);
        }
        *(float *)b->data = fVar46;
        in_R10D = 0;
      }
      lVar19 = CONCAT44(in_stack_00000014,keepdims);
      piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            pMVar31 = (Mat *)local_88.data;
            if ((Mat *)local_88.data != (Mat *)0x0) {
              free(local_88.data);
              pMVar31 = (Mat *)local_88.data;
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
            pMVar31 = (Mat *)local_88.data;
          }
        }
      }
      uVar37 = uVar37 & 0xffffffff;
      uVar41 = uVar41 & 0xffffffff;
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      bVar7 = false;
    }
    else if (reduce_w && !reduce_h) {
      if (_post_process == 0) {
        pMVar31 = pMVar12;
        Mat::create(b,uVar11,sVar2,*(Allocator **)(lVar19 + 8));
      }
      else {
        pMVar31 = (Mat *)0x1;
        Mat::create(b,1,uVar11,sVar2,*(Allocator **)(lVar19 + 8));
      }
      uVar37 = uVar37 & 0xffffffff;
      uVar41 = uVar41 & 0xffffffff;
      if (0 < (int)uVar11) {
        iVar1 = a->w;
        sVar33 = a->elemsize;
        pvVar21 = a->data;
        pvVar39 = b->data;
        pMVar31 = (Mat *)0x0;
        do {
          fVar46 = 0.0;
          if (0 < (int)uVar10) {
            pMVar25 = (Mat *)0x0;
            do {
              fVar46 = fVar46 + ABS(*(float *)((long)pvVar21 + (long)pMVar25 * 4));
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            } while (pMVar20 != pMVar25);
          }
          *(float *)((long)pvVar39 + (long)pMVar31 * 4) = fVar46;
          pMVar31 = (Mat *)((long)&pMVar31->data + 1);
          pvVar21 = (void *)((long)pvVar21 + (long)iVar1 * sVar33);
        } while (pMVar31 != pMVar12);
      }
      bVar7 = false;
      in_R10D = 0;
    }
    else if (reduce_h && !reduce_w) {
      if (_post_process == 0) {
        pMVar31 = (Mat *)(ulong)uVar10;
        Mat::create(b,uVar10,sVar2,*(Allocator **)(lVar19 + 8));
      }
      else {
        pMVar31 = (Mat *)(ulong)uVar10;
        Mat::create(b,uVar10,1,sVar2,*(Allocator **)(lVar19 + 8));
      }
      uVar35 = b->c * (int)b->cstep;
      pvVar21 = b->data;
      if (0 < (int)uVar35) {
        pMVar31 = (Mat *)0x0;
        memset(pvVar21,0,(ulong)uVar35 << 2);
      }
      if ((int)uVar11 < 1) {
        bVar7 = false;
        in_R10D = 0;
        lVar19 = CONCAT44(in_stack_00000014,keepdims);
        uVar37 = uVar37 & 0xffffffff;
        uVar41 = uVar41 & 0xffffffff;
      }
      else {
        pvVar39 = a->data;
        iVar1 = a->w;
        sVar33 = a->elemsize;
        pMVar25 = (Mat *)0x0;
        uVar37 = uVar37 & 0xffffffff;
        uVar41 = uVar41 & 0xffffffff;
        do {
          if (0 < (int)uVar10) {
            pMVar31 = (Mat *)0x0;
            do {
              *(float *)((long)pvVar21 + (long)pMVar31 * 4) =
                   ABS(*(float *)((long)pvVar39 + (long)pMVar31 * 4)) +
                   *(float *)((long)pvVar21 + (long)pMVar31 * 4);
              pMVar31 = (Mat *)((long)&pMVar31->data + 1);
            } while (pMVar20 != pMVar31);
          }
          pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          pvVar39 = (void *)((long)pvVar39 + (long)iVar1 * sVar33);
        } while (pMVar25 != pMVar12);
        bVar7 = false;
        in_R10D = 0;
        lVar19 = CONCAT44(in_stack_00000014,keepdims);
      }
    }
    else {
      bVar7 = true;
    }
    if (!bVar7) goto LAB_0033ca16;
  }
  else if (iVar27 == 1) {
    iVar27 = a->w;
    pMVar31 = (Mat *)0x1;
    Mat::create(b,1,sVar2,*(Allocator **)(lVar19 + 8));
    if ((long)iVar27 < 1) {
      fVar46 = 0.0;
    }
    else {
      fVar46 = 0.0;
      lVar19 = 0;
      do {
        fVar46 = fVar46 + ABS(*(float *)((long)a->data + lVar19 * 4));
        lVar19 = lVar19 + 1;
      } while (iVar27 != lVar19);
    }
    *(float *)b->data = fVar46;
    in_R10D = 0;
    goto LAB_0033ca16;
  }
  bVar8 = (byte)uVar41;
  if (iVar27 == 3) {
    uVar10 = a->w;
    lVar42 = (long)(int)uVar10;
    uVar11 = a->h;
    uVar44 = (ulong)uVar11;
    uVar35 = a->c;
    pMVar12 = (Mat *)(ulong)uVar35;
    uVar28 = uVar11 * uVar10;
    bVar29 = bVar8 ^ 1;
    bVar24 = (byte)uVar37;
    bVar18 = bVar24 ^ 1;
    pMVar31 = pMVar12;
    if ((bVar29 == 0 && reduce_h) && bVar18 == 0) {
      if (_post_process == 0) {
        Mat::create(b,1,sVar2,*(Allocator **)(lVar19 + 8));
      }
      else {
        Mat::create(b,1,1,1,sVar2,*(Allocator **)(lVar19 + 8));
      }
      local_88.cstep = 0;
      local_88.data = (Mat *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      Mat::create(&local_88,uVar35,sVar2,
                  *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
      in_R10D = -100;
      if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        if ((int)uVar35 < 1) {
LAB_0033af81:
          fVar46 = 0.0;
        }
        else {
          sVar33 = a->elemsize;
          sVar36 = a->cstep;
          pvVar21 = a->data;
          pMVar31 = (Mat *)(ulong)uVar28;
          pMVar20 = (Mat *)0x0;
          do {
            fVar46 = 0.0;
            if (0 < (int)uVar28) {
              pMVar25 = (Mat *)0x0;
              do {
                fVar46 = fVar46 + ABS(*(float *)((long)pvVar21 + (long)pMVar25 * 4));
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar31 != pMVar25);
            }
            *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4) = fVar46;
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar21 = (void *)((long)pvVar21 + sVar33 * sVar36);
          } while (pMVar20 != pMVar12);
          if ((int)uVar35 < 1) goto LAB_0033af81;
          fVar46 = 0.0;
          pMVar20 = (Mat *)0x0;
          do {
            fVar46 = fVar46 + *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4);
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          } while (pMVar12 != pMVar20);
        }
        *(float *)b->data = fVar46;
        in_R10D = 0;
      }
      piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_88.allocator == (Allocator *)0x0) {
            pMVar31 = (Mat *)local_88.data;
            if ((Mat *)local_88.data != (Mat *)0x0) {
              free(local_88.data);
              pMVar31 = (Mat *)local_88.data;
            }
          }
          else {
            (*(local_88.allocator)->_vptr_Allocator[3])();
            pMVar31 = (Mat *)local_88.data;
          }
        }
      }
LAB_0033b63e:
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      bVar7 = false;
    }
    else {
      if ((bVar29 != 0 || !reduce_h) || bVar24 != 0) {
        pMVar20 = (Mat *)(ulong)uVar10;
        if ((bVar29 == 0 && !reduce_h) && bVar18 == 0) {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar11,sVar2,pAVar3);
          }
          else {
            Mat::create(b,1,uVar11,1,sVar2,pAVar3);
          }
          local_88.cstep = 0;
          local_88.data = (Mat *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.allocator = (Allocator *)0x0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.d = 0;
          local_88.c = 0;
          pMVar31 = (Mat *)0x1;
          Mat::create(&local_88,1,uVar11,uVar35,sVar2,
                      *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
          sVar33 = local_88.cstep;
          pMVar25 = (Mat *)local_88.data;
          in_R10D = -100;
          if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0)) {
            uVar28 = (int)local_88.cstep * local_88.c;
            if (0 < (int)uVar28) {
              pMVar31 = (Mat *)0x0;
              memset(local_88.data,0,(ulong)uVar28 << 2);
            }
            if (0 < (int)uVar35) {
              pbVar40 = (bool *)a->data;
              sVar36 = a->elemsize;
              sVar4 = a->cstep;
              pMVar31 = (Mat *)(lVar42 * 4);
              pMVar32 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar41 = 0;
                  pbVar38 = pbVar40;
                  do {
                    fVar46 = 0.0;
                    if (0 < (int)uVar10) {
                      pMVar22 = (Mat *)0x0;
                      do {
                        fVar46 = fVar46 + ABS(*(float *)(pbVar38 + (long)pMVar22 * 4));
                        pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                      } while (pMVar20 != pMVar22);
                    }
                    *(float *)((long)&pMVar25->data +
                              uVar41 * 4 +
                              CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                              sVar33 * (long)pMVar32) = fVar46;
                    uVar41 = uVar41 + 1;
                    pbVar38 = (bool *)((long)&pMVar31->data + (long)pbVar38);
                  } while (uVar41 != uVar44);
                }
                pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                pbVar40 = pbVar40 + sVar36 * sVar4;
              } while (pMVar32 != pMVar12);
            }
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              pMVar31 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if ((int)uVar35 < 1) {
              in_R10D = 0;
            }
            else {
              pvVar21 = b->data;
              pMVar20 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  uVar41 = 0;
                  do {
                    *(float *)((long)pvVar21 + uVar41 * 4) =
                         *(float *)((long)&pMVar25->data + uVar41 * 4) +
                         *(float *)((long)pvVar21 + uVar41 * 4);
                    uVar41 = uVar41 + 1;
                  } while (uVar44 != uVar41);
                }
                pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                pMVar25 = (Mat *)((long)&pMVar25->data +
                                 sVar33 * CONCAT44(local_88.elemsize._4_4_,
                                                   (undefined4)local_88.elemsize));
              } while (pMVar20 != pMVar12);
              in_R10D = 0;
            }
          }
          piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_88.allocator == (Allocator *)0x0) {
LAB_0033b620:
                pMVar31 = (Mat *)local_88.data;
                if ((Mat *)local_88.data != (Mat *)0x0) {
                  free(local_88.data);
                  pMVar31 = (Mat *)local_88.data;
                }
              }
              else {
                (*(local_88.allocator)->_vptr_Allocator[3])();
                pMVar31 = (Mat *)local_88.data;
              }
            }
          }
        }
        else {
          if ((!reduce_h || bVar8 != 0) || bVar18 != 0) {
            if ((bVar29 == 0 && !reduce_h) && bVar24 == 0) {
              pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
              if (_post_process == 0) {
                Mat::create(b,uVar11,uVar35,sVar2,pAVar3);
              }
              else {
                Mat::create(b,1,uVar11,uVar35,sVar2,pAVar3);
              }
              pMVar31 = a;
              if ((int)uVar35 < 1) {
LAB_0033b54e:
                in_R10D = 0;
                bVar7 = false;
              }
              else {
                sVar33 = a->cstep;
                if (_post_process == 0) {
                  sVar36 = (size_t)b->w;
                }
                else {
                  sVar36 = b->cstep;
                }
                pvVar21 = a->data;
                sVar4 = b->elemsize;
                sVar5 = a->elemsize;
                pMVar31 = (Mat *)b->data;
                pMVar25 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    uVar41 = 0;
                    pvVar39 = pvVar21;
                    do {
                      fVar46 = 0.0;
                      if (0 < (int)uVar10) {
                        pMVar32 = (Mat *)0x0;
                        do {
                          fVar46 = fVar46 + ABS(*(float *)((long)pvVar39 + (long)pMVar32 * 4));
                          pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                        } while (pMVar20 != pMVar32);
                      }
                      *(float *)((long)&pMVar31->data + uVar41 * 4 + sVar36 * sVar4 * (long)pMVar25)
                           = fVar46;
                      uVar41 = uVar41 + 1;
                      pvVar39 = (void *)((long)pvVar39 + lVar42 * 4);
                    } while (uVar41 != uVar44);
                  }
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  pvVar21 = (void *)((long)pvVar21 + sVar33 * sVar5);
                  bVar7 = false;
                  in_R10D = 0;
                } while (pMVar25 != pMVar12);
              }
            }
            else {
              bVar18 = (byte)(uVar41 & 0xffffffff) | reduce_h | bVar18;
              pMVar31 = (Mat *)CONCAT71((int7)((uVar41 & 0xffffffff) >> 8),bVar18);
              if (bVar18 == 0) {
                pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                if (_post_process == 0) {
                  Mat::create(b,uVar10,uVar11,sVar2,pAVar3);
                  pMVar31 = pMVar20;
                }
                else {
                  Mat::create(b,uVar10,uVar11,1,sVar2,pAVar3);
                  pMVar31 = pMVar20;
                }
                uVar10 = b->c * (int)b->cstep;
                if (0 < (int)uVar10) {
                  pMVar31 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar10 << 2);
                }
                if ((int)uVar35 < 1) {
                  bVar7 = false;
                  in_R10D = 0;
                }
                else {
                  pvVar21 = a->data;
                  sVar33 = a->elemsize;
                  sVar36 = a->cstep;
                  pvVar39 = b->data;
                  pMVar31 = (Mat *)(ulong)uVar28;
                  pMVar20 = (Mat *)0x0;
                  bVar7 = false;
                  in_R10D = 0;
                  do {
                    if (0 < (int)uVar28) {
                      pMVar25 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar39 + (long)pMVar25 * 4) =
                             ABS(*(float *)((long)pvVar21 + (long)pMVar25 * 4)) +
                             *(float *)((long)pvVar39 + (long)pMVar25 * 4);
                        pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                      } while (pMVar31 != pMVar25);
                    }
                    pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                    pvVar21 = (void *)((long)pvVar21 + sVar33 * sVar36);
                  } while (pMVar20 != pMVar12);
                }
              }
              else {
                bVar7 = true;
                if ((reduce_h && bVar8 == 0) && bVar24 == 0) {
                  pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
                  if (_post_process == 0) {
                    pMVar31 = pMVar20;
                    Mat::create(b,uVar10,uVar35,sVar2,pAVar3);
                  }
                  else {
                    pMVar31 = (Mat *)(ulong)uVar10;
                    Mat::create(b,uVar10,1,uVar35,sVar2,pAVar3);
                  }
                  sVar33 = b->cstep;
                  uVar28 = b->c * (int)sVar33;
                  if (0 < (int)uVar28) {
                    pMVar31 = (Mat *)0x0;
                    memset(b->data,0,(ulong)uVar28 << 2);
                  }
                  if ((int)uVar35 < 1) goto LAB_0033b54e;
                  pvVar21 = a->data;
                  sVar36 = a->cstep;
                  if (_post_process == 0) {
                    sVar33 = (long)b->w;
                  }
                  pMVar31 = (Mat *)b->data;
                  sVar4 = a->elemsize;
                  sVar5 = b->elemsize;
                  pMVar25 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar11) {
                      uVar35 = 0;
                      pvVar39 = pvVar21;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar32 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar31->data + (long)pMVar32 * 4) =
                                 ABS(*(float *)((long)pvVar39 + (long)pMVar32 * 4)) +
                                 *(float *)((long)&pMVar31->data + (long)pMVar32 * 4);
                            pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                          } while (pMVar20 != pMVar32);
                        }
                        uVar35 = uVar35 + 1;
                        pvVar39 = (void *)((long)pvVar39 + (long)(int)uVar10 * 4);
                      } while (uVar35 != uVar11);
                    }
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                    pvVar21 = (void *)((long)pvVar21 + sVar36 * sVar4);
                    pMVar31 = (Mat *)((long)&pMVar31->data + sVar33 * sVar5);
                    bVar7 = false;
                    in_R10D = 0;
                  } while (pMVar25 != pMVar12);
                }
              }
            }
            goto LAB_0033b666;
          }
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar10,sVar2,pAVar3);
          }
          else {
            Mat::create(b,uVar10,1,1,sVar2,pAVar3);
          }
          local_88.cstep = 0;
          local_88.data = (Mat *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.allocator = (Allocator *)0x0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.d = 0;
          local_88.c = 0;
          pMVar31 = pMVar20;
          Mat::create(&local_88,uVar10,1,uVar35,sVar2,
                      *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
          sVar33 = local_88.cstep;
          pMVar25 = (Mat *)local_88.data;
          in_R10D = -100;
          if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0)) {
            uVar28 = (int)local_88.cstep * local_88.c;
            if (0 < (int)uVar28) {
              pMVar31 = (Mat *)0x0;
              memset(local_88.data,0,(ulong)uVar28 << 2);
            }
            if (0 < (int)uVar35) {
              sVar36 = a->elemsize;
              sVar4 = a->cstep;
              pvVar21 = a->data;
              pMVar31 = (Mat *)(CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                               sVar33);
              pMVar22 = (Mat *)0x0;
              pMVar32 = pMVar25;
              do {
                if (0 < (int)uVar11) {
                  uVar28 = 0;
                  pvVar39 = pvVar21;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar34 = (Mat *)0x0;
                      do {
                        *(float *)((long)&pMVar32->data + (long)pMVar34 * 4) =
                             ABS(*(float *)((long)pvVar39 + (long)pMVar34 * 4)) +
                             *(float *)((long)&pMVar32->data + (long)pMVar34 * 4);
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                      } while (pMVar20 != pMVar34);
                    }
                    uVar28 = uVar28 + 1;
                    pvVar39 = (void *)((long)pvVar39 + lVar42 * 4);
                  } while (uVar28 != uVar11);
                }
                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                pvVar21 = (void *)((long)pvVar21 + sVar36 * sVar4);
                pMVar32 = (Mat *)((long)&pMVar31->data + (long)&pMVar32->data);
              } while (pMVar22 != pMVar12);
            }
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              pMVar31 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            if ((int)uVar35 < 1) {
              in_R10D = 0;
            }
            else {
              pvVar21 = b->data;
              pMVar32 = (Mat *)0x0;
              do {
                if (0 < (int)uVar10) {
                  pMVar22 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar21 + (long)pMVar22 * 4) =
                         *(float *)((long)&pMVar25->data + (long)pMVar22 * 4) +
                         *(float *)((long)pvVar21 + (long)pMVar22 * 4);
                    pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                  } while (pMVar20 != pMVar22);
                }
                pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                pMVar25 = (Mat *)((long)&pMVar25->data +
                                 sVar33 * CONCAT44(local_88.elemsize._4_4_,
                                                   (undefined4)local_88.elemsize));
              } while (pMVar32 != pMVar12);
              in_R10D = 0;
            }
          }
          piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_88.allocator == (Allocator *)0x0) goto LAB_0033b620;
              (*(local_88.allocator)->_vptr_Allocator[3])();
              pMVar31 = (Mat *)local_88.data;
            }
          }
        }
        goto LAB_0033b63e;
      }
      if (_post_process == 0) {
        Mat::create(b,uVar35,sVar2,*(Allocator **)(lVar19 + 8));
      }
      else {
        pMVar31 = (Mat *)0x1;
        Mat::create(b,1,1,uVar35,sVar2,*(Allocator **)(lVar19 + 8));
      }
      if (0 < (int)uVar35) {
        pvVar21 = a->data;
        sVar33 = a->elemsize;
        pvVar39 = b->data;
        pMVar31 = (Mat *)(b->elemsize * b->cstep);
        sVar36 = a->cstep;
        pMVar20 = (Mat *)0x0;
        do {
          fVar46 = 0.0;
          if (0 < (int)uVar28) {
            uVar41 = 0;
            do {
              fVar46 = fVar46 + ABS(*(float *)((long)pvVar21 + uVar41 * 4));
              uVar41 = uVar41 + 1;
            } while (uVar28 != uVar41);
          }
          lVar19 = (long)pMVar31 * (long)pMVar20;
          if (_post_process == 0) {
            lVar19 = (long)pMVar20 * 4;
          }
          *(float *)((long)pvVar39 + lVar19) = fVar46;
          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          pvVar21 = (void *)((long)pvVar21 + sVar33 * sVar36);
        } while (pMVar20 != pMVar12);
      }
      bVar7 = false;
      in_R10D = 0;
    }
LAB_0033b666:
    uVar37 = uVar37 & 0xffffffff;
    if (!bVar7) goto LAB_0033ca16;
  }
  if (iVar27 == 4) {
    uVar10 = a->w;
    lVar19 = (long)(int)uVar10;
    uVar11 = a->h;
    pMVar25 = (Mat *)(ulong)uVar11;
    uVar35 = a->d;
    pMVar20 = (Mat *)(ulong)uVar35;
    uVar28 = a->c;
    pMVar12 = (Mat *)(ulong)uVar28;
    uVar43 = uVar11 * uVar10;
    pMVar31 = (Mat *)(ulong)uVar43;
    uVar45 = uVar43 * uVar35;
    bVar24 = bVar8 ^ 1;
    pMVar32 = (Mat *)(uVar37 & 0xffffffff ^ 1);
    cVar9 = (char)uVar37;
    cVar30 = (char)pMVar32;
    if (((bVar24 == 0 && reduce_h) && reduce_d) && cVar30 == '\0') {
      pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        Mat::create(b,1,sVar2,pAVar3);
      }
      else {
        Mat::create(b,1,1,1,1,sVar2,pAVar3);
      }
      local_88.cstep = 0;
      local_88.data = (Mat *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      pMVar31 = pMVar12;
      Mat::create(&local_88,uVar28,sVar2,
                  *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
      in_R10D = -100;
      if (((Mat *)local_88.data != (Mat *)0x0) && ((long)local_88.c * local_88.cstep != 0)) {
        if ((int)uVar28 < 1) {
LAB_0033b9f7:
          fVar46 = 0.0;
        }
        else {
          sVar2 = a->elemsize;
          sVar33 = a->cstep;
          pvVar21 = a->data;
          pMVar31 = (Mat *)(ulong)uVar45;
          pMVar20 = (Mat *)0x0;
          do {
            fVar46 = 0.0;
            if (0 < (int)uVar45) {
              pMVar25 = (Mat *)0x0;
              do {
                fVar46 = fVar46 + ABS(*(float *)((long)pvVar21 + (long)pMVar25 * 4));
                pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              } while (pMVar31 != pMVar25);
            }
            *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4) = fVar46;
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar21 = (void *)((long)pvVar21 + sVar2 * sVar33);
          } while (pMVar20 != pMVar12);
          if ((int)uVar28 < 1) goto LAB_0033b9f7;
          fVar46 = 0.0;
          pMVar20 = (Mat *)0x0;
          do {
            fVar46 = fVar46 + *(float *)((long)(void **)local_88.data + (long)pMVar20 * 4);
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          } while (pMVar12 != pMVar20);
        }
        *(float *)b->data = fVar46;
        in_R10D = 0;
      }
      piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_88.allocator == (Allocator *)0x0) goto LAB_0033c9cb;
          (*(local_88.allocator)->_vptr_Allocator[3])();
          pMVar31 = (Mat *)local_88.data;
        }
      }
      goto LAB_0033c9de;
    }
    if (((bVar24 == 0 && reduce_h) && reduce_d) && cVar9 == '\0') {
      pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        pMVar32 = pMVar12;
        Mat::create(b,uVar28,sVar2,pAVar3);
      }
      else {
        pMVar32 = (Mat *)0x1;
        Mat::create(b,1,1,1,uVar28,sVar2,pAVar3);
      }
      if (0 < (int)uVar28) {
        pvVar21 = a->data;
        sVar2 = a->elemsize;
        pvVar39 = b->data;
        pMVar32 = (Mat *)(b->elemsize * b->cstep);
        sVar33 = a->cstep;
        pMVar31 = (Mat *)0x0;
        do {
          fVar46 = 0.0;
          if (0 < (int)uVar45) {
            uVar41 = 0;
            do {
              fVar46 = fVar46 + ABS(*(float *)((long)pvVar21 + uVar41 * 4));
              uVar41 = uVar41 + 1;
            } while (uVar45 != uVar41);
          }
          lVar19 = (long)pMVar32 * (long)pMVar31;
          if (_post_process == 0) {
            lVar19 = (long)pMVar31 * 4;
          }
          *(float *)((long)pvVar39 + lVar19) = fVar46;
          pMVar31 = (Mat *)((long)&pMVar31->data + 1);
          pvVar21 = (void *)((long)pvVar21 + sVar2 * sVar33);
        } while (pMVar31 != pMVar12);
      }
LAB_0033badf:
      pMVar31 = pMVar32;
      bVar7 = false;
      in_R10D = 0;
      goto LAB_0033ca05;
    }
    if (((bVar24 == 0 && reduce_h) && !reduce_d) && cVar30 == '\0') {
      pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
      if (_post_process == 0) {
        Mat::create(b,uVar35,sVar2,pAVar3);
      }
      else {
        Mat::create(b,1,1,uVar35,1,sVar2,pAVar3);
      }
      local_88.cstep = 0;
      local_88.data = (Mat *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.allocator = (Allocator *)0x0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      pMVar31 = (Mat *)0x1;
      Mat::create(&local_88,1,uVar35,uVar28,sVar2,
                  *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
      sVar2 = local_88.cstep;
      pMVar25 = (Mat *)local_88.data;
      in_R10D = -100;
      if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0)) {
        uVar10 = (int)local_88.cstep * local_88.c;
        if (0 < (int)uVar10) {
          pMVar31 = (Mat *)0x0;
          memset(local_88.data,0,(ulong)uVar10 << 2);
        }
        if (0 < (int)uVar28) {
          pbVar40 = (bool *)a->data;
          sVar33 = a->elemsize;
          sVar36 = a->cstep;
          pMVar31 = (Mat *)((long)(int)uVar43 * 4);
          pMVar32 = (Mat *)0x0;
          do {
            if (0 < (int)uVar35) {
              pMVar22 = (Mat *)0x0;
              pbVar38 = pbVar40;
              do {
                fVar46 = 0.0;
                if (0 < (int)uVar43) {
                  uVar41 = 0;
                  do {
                    fVar46 = fVar46 + ABS(*(float *)(pbVar38 + uVar41 * 4));
                    uVar41 = uVar41 + 1;
                  } while (uVar43 != uVar41);
                }
                *(float *)((long)&pMVar25->data +
                          (long)pMVar22 * 4 +
                          CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) * sVar2 *
                          (long)pMVar32) = fVar46;
                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                pbVar38 = (bool *)((long)&pMVar31->data + (long)pbVar38);
              } while (pMVar22 != pMVar20);
            }
            pMVar32 = (Mat *)((long)&pMVar32->data + 1);
            pbVar40 = pbVar40 + sVar33 * sVar36;
          } while (pMVar32 != pMVar12);
        }
        uVar10 = b->c * (int)b->cstep;
        if (0 < (int)uVar10) {
          pMVar31 = (Mat *)0x0;
          memset(b->data,0,(ulong)uVar10 << 2);
        }
        if (0 < (int)uVar28) {
          pvVar21 = b->data;
          pMVar32 = (Mat *)0x0;
          do {
            if (0 < (int)uVar35) {
              pMVar22 = (Mat *)0x0;
              do {
                *(float *)((long)pvVar21 + (long)pMVar22 * 4) =
                     *(float *)((long)&pMVar25->data + (long)pMVar22 * 4) +
                     *(float *)((long)pvVar21 + (long)pMVar22 * 4);
                pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              } while (pMVar20 != pMVar22);
            }
            pMVar32 = (Mat *)((long)&pMVar32->data + 1);
            pMVar25 = (Mat *)((long)&pMVar25->data +
                             sVar2 * CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                             );
          } while (pMVar32 != pMVar12);
        }
        in_R10D = 0;
      }
      piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
      if (piVar6 == (int *)0x0) goto LAB_0033c9de;
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 != 0) goto LAB_0033c9de;
      if (local_88.allocator != (Allocator *)0x0) {
        (*(local_88.allocator)->_vptr_Allocator[3])();
        pMVar31 = (Mat *)local_88.data;
        goto LAB_0033c9de;
      }
LAB_0033c9cb:
      pMVar31 = (Mat *)local_88.data;
      if ((Mat *)local_88.data != (Mat *)0x0) {
        free(local_88.data);
        pMVar31 = (Mat *)local_88.data;
      }
LAB_0033c9de:
      local_88.cstep = 0;
      local_88.data = (void *)0x0;
      local_88.refcount._0_4_ = 0;
      local_88.refcount._4_4_ = 0;
      local_88.elemsize._0_4_ = 0;
      local_88.elemsize._4_4_ = 0;
      local_88.elempack = 0;
      local_88.dims = 0;
      local_88.w = 0;
      local_88.h = 0;
      local_88.d = 0;
      local_88.c = 0;
      bVar7 = false;
    }
    else {
      pMVar22 = (Mat *)(ulong)uVar10;
      if (((bVar24 == 0 && !reduce_h) && reduce_d) && cVar30 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar11,sVar2,pAVar3);
        }
        else {
          Mat::create(b,1,uVar11,1,1,sVar2,pAVar3);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar31 = (Mat *)0x1;
        Mat::create(&local_88,1,uVar11,uVar28,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_88.cstep;
        pMVar20 = (Mat *)local_88.data;
        in_R10D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0)) {
          uVar43 = (int)local_88.cstep * local_88.c;
          if (0 < (int)uVar43) {
            pMVar31 = (Mat *)0x0;
            memset(local_88.data,0,(ulong)uVar43 << 2);
          }
          if (0 < (int)uVar28) {
            pvVar21 = a->data;
            sVar33 = a->elemsize;
            sVar36 = a->cstep;
            pMVar31 = (Mat *)(lVar19 * 4);
            pMVar32 = (Mat *)0x0;
            do {
              if (0 < (int)uVar35) {
                lVar19 = CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) * sVar2 *
                         (long)pMVar32;
                pbVar40 = (bool *)(sVar33 * sVar36 * (long)pMVar32 + (long)pvVar21);
                uVar43 = 0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar34 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        fVar46 = *(float *)((long)&pMVar20->data + (long)pMVar34 * 4 + lVar19);
                        pMVar13 = (Mat *)0x0;
                        do {
                          fVar46 = fVar46 + ABS(*(float *)(pbVar40 + (long)pMVar13 * 4));
                          *(float *)((long)&pMVar20->data + (long)pMVar34 * 4 + lVar19) = fVar46;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                        } while (pMVar22 != pMVar13);
                      }
                      pbVar40 = (bool *)((long)&pMVar31->data + (long)pbVar40);
                      pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                    } while (pMVar34 != pMVar25);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 != uVar35);
              }
              pMVar32 = (Mat *)((long)&pMVar32->data + 1);
            } while (pMVar32 != pMVar12);
          }
          uVar10 = b->c * (int)b->cstep;
          if (0 < (int)uVar10) {
            pMVar31 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar10 << 2);
          }
          if (0 < (int)uVar28) {
            pvVar21 = b->data;
            pMVar32 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar22 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar21 + (long)pMVar22 * 4) =
                       *(float *)((long)&pMVar20->data + (long)pMVar22 * 4) +
                       *(float *)((long)pvVar21 + (long)pMVar22 * 4);
                  pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                } while (pMVar25 != pMVar22);
              }
              pMVar32 = (Mat *)((long)&pMVar32->data + 1);
              pMVar20 = (Mat *)((long)&pMVar20->data +
                               sVar2 * CONCAT44(local_88.elemsize._4_4_,
                                                (undefined4)local_88.elemsize));
            } while (pMVar32 != pMVar12);
          }
          in_R10D = 0;
        }
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_0033c9cb;
            (*(local_88.allocator)->_vptr_Allocator[3])();
            pMVar31 = (Mat *)local_88.data;
          }
        }
        goto LAB_0033c9de;
      }
      if (((reduce_h && bVar8 == 0) && reduce_d) && cVar30 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar10,sVar2,pAVar3);
        }
        else {
          Mat::create(b,uVar10,1,1,1,sVar2,pAVar3);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar31 = (Mat *)(ulong)uVar10;
        Mat::create(&local_88,uVar10,1,uVar28,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_88.cstep;
        pMVar20 = (Mat *)local_88.data;
        in_R10D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) && (local_88.cstep * (long)local_88.c != 0)) {
          uVar43 = (int)local_88.cstep * local_88.c;
          if (0 < (int)uVar43) {
            memset(local_88.data,0,(ulong)uVar43 << 2);
          }
          if (0 < (int)uVar28) {
            sVar33 = a->elemsize;
            sVar36 = a->cstep;
            pvVar21 = a->data;
            pMVar25 = (Mat *)0x0;
            pMVar31 = pMVar20;
            do {
              if (0 < (int)uVar35) {
                pvVar39 = (void *)(sVar33 * sVar36 * (long)pMVar25 + (long)pvVar21);
                uVar43 = 0;
                do {
                  if (0 < (int)uVar11) {
                    uVar45 = 0;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar32 = (Mat *)0x0;
                        do {
                          *(float *)((long)&pMVar31->data + (long)pMVar32 * 4) =
                               ABS(*(float *)((long)pvVar39 + (long)pMVar32 * 4)) +
                               *(float *)((long)&pMVar31->data + (long)pMVar32 * 4);
                          pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                        } while (pMVar22 != pMVar32);
                      }
                      pvVar39 = (void *)((long)pvVar39 + lVar19 * 4);
                      uVar45 = uVar45 + 1;
                    } while (uVar45 != uVar11);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 != uVar35);
              }
              pMVar25 = (Mat *)((long)&pMVar25->data + 1);
              pMVar31 = (Mat *)((long)&pMVar31->data +
                               CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                               sVar2);
            } while (pMVar25 != pMVar12);
          }
          uVar11 = b->c * (int)b->cstep;
          if (0 < (int)uVar11) {
            memset(b->data,0,(ulong)uVar11 << 2);
          }
          if (0 < (int)uVar28) {
            pvVar21 = b->data;
            pMVar31 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                pMVar25 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar21 + (long)pMVar25 * 4) =
                       *(float *)((long)&pMVar20->data + (long)pMVar25 * 4) +
                       *(float *)((long)pvVar21 + (long)pMVar25 * 4);
                  pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                } while (pMVar22 != pMVar25);
              }
              pMVar31 = (Mat *)((long)&pMVar31->data + 1);
              pMVar20 = (Mat *)((long)&pMVar20->data +
                               sVar2 * CONCAT44(local_88.elemsize._4_4_,
                                                (undefined4)local_88.elemsize));
            } while (pMVar31 != pMVar12);
          }
          in_R10D = 0;
          pMVar31 = pMVar12;
        }
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_0033c9cb;
            (*(local_88.allocator)->_vptr_Allocator[3])();
            pMVar31 = (Mat *)local_88.data;
          }
        }
        goto LAB_0033c9de;
      }
      if (((bVar24 == 0 && reduce_h) && !reduce_d) && cVar9 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          pMVar32 = pMVar20;
          Mat::create(b,uVar35,uVar28,sVar2,pAVar3);
        }
        else {
          pMVar32 = (Mat *)0x1;
          Mat::create(b,1,1,uVar35,uVar28,sVar2,pAVar3);
        }
        if ((int)uVar28 < 1) goto LAB_0033badf;
        sVar2 = a->cstep;
        if (_post_process == 0) {
          sVar33 = (size_t)b->w;
        }
        else {
          sVar33 = b->cstep;
        }
        pvVar21 = a->data;
        sVar36 = b->elemsize;
        sVar4 = a->elemsize;
        pvVar39 = b->data;
        pMVar25 = (Mat *)0x0;
        do {
          if (0 < (int)uVar35) {
            pMVar32 = (Mat *)0x0;
            pvVar17 = pvVar21;
            do {
              fVar46 = 0.0;
              if (0 < (int)uVar43) {
                pMVar22 = (Mat *)0x0;
                do {
                  fVar46 = fVar46 + ABS(*(float *)((long)pvVar17 + (long)pMVar22 * 4));
                  pMVar22 = (Mat *)((long)&pMVar22->data + 1);
                } while (pMVar31 != pMVar22);
              }
              *(float *)((long)pvVar39 + (long)pMVar32 * 4 + sVar33 * sVar36 * (long)pMVar25) =
                   fVar46;
              pMVar32 = (Mat *)((long)&pMVar32->data + 1);
              pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar43 * 4);
            } while (pMVar32 != pMVar20);
          }
          pMVar25 = (Mat *)((long)&pMVar25->data + 1);
          pvVar21 = (void *)((long)pvVar21 + sVar2 * sVar4);
          bVar7 = false;
          in_R10D = 0;
        } while (pMVar25 != pMVar12);
        goto LAB_0033ca05;
      }
      if (((bVar24 == 0 && !reduce_h) && !reduce_d) && cVar30 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar11,uVar35,sVar2,pAVar3);
        }
        else {
          Mat::create(b,1,uVar11,uVar35,1,sVar2,pAVar3);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar31 = pMVar25;
        Mat::create(&local_88,uVar11,uVar35,uVar28,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_88.cstep;
        pMVar32 = (Mat *)local_88.data;
        in_R10D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) &&
           (pMVar31 = (Mat *)local_88.cstep, local_88.cstep * (long)local_88.c != 0)) {
          uVar43 = (int)local_88.cstep * local_88.c;
          if (0 < (int)uVar43) {
            pMVar31 = (Mat *)0x0;
            memset(local_88.data,0,(ulong)uVar43 << 2);
          }
          if (0 < (int)uVar28) {
            pvVar21 = a->data;
            sVar33 = a->elemsize;
            sVar36 = a->cstep;
            pMVar31 = (Mat *)(CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                             sVar2);
            pMVar34 = (Mat *)0x0;
            do {
              if (0 < (int)uVar35) {
                pvVar39 = (void *)(sVar33 * sVar36 * (long)pMVar34 + (long)pvVar21);
                pMVar13 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar11) {
                    lVar42 = (long)local_88.w *
                             CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                             (long)pMVar13 + (long)pMVar31 * (long)pMVar34;
                    pMVar15 = (Mat *)0x0;
                    do {
                      if (0 < (int)uVar10) {
                        fVar46 = *(float *)((long)&pMVar32->data + (long)pMVar15 * 4 + lVar42);
                        pMVar14 = (Mat *)0x0;
                        do {
                          fVar46 = fVar46 + ABS(*(float *)((long)pvVar39 + (long)pMVar14 * 4));
                          *(float *)((long)&pMVar32->data + (long)pMVar15 * 4 + lVar42) = fVar46;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                        } while (pMVar22 != pMVar14);
                      }
                      pvVar39 = (void *)((long)pvVar39 + lVar19 * 4);
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    } while (pMVar15 != pMVar25);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                } while (pMVar13 != pMVar20);
              }
              pMVar34 = (Mat *)((long)&pMVar34->data + 1);
            } while (pMVar34 != pMVar12);
          }
          uVar10 = b->c * (int)b->cstep;
          if (0 < (int)uVar10) {
            pMVar31 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar10 << 2);
          }
          if (0 < (int)uVar28) {
            pMVar22 = (Mat *)0x0;
            do {
              if (0 < (int)uVar35) {
                pMVar31 = (Mat *)b->data;
                lVar19 = (long)b->h * (long)b->w;
                if (_post_process == 0) {
                  lVar19 = (long)b->w;
                }
                sVar33 = b->elemsize;
                pMVar13 = (Mat *)0x0;
                pMVar34 = pMVar32;
                do {
                  if (0 < (int)uVar11) {
                    pMVar15 = (Mat *)0x0;
                    do {
                      *(float *)((long)&pMVar31->data + (long)pMVar15 * 4) =
                           *(float *)((long)&pMVar34->data + (long)pMVar15 * 4) +
                           *(float *)((long)&pMVar31->data + (long)pMVar15 * 4);
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    } while (pMVar25 != pMVar15);
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                  pMVar34 = (Mat *)((long)&pMVar34->data +
                                   (long)local_88.w *
                                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                  pMVar31 = (Mat *)((long)&pMVar31->data + lVar19 * sVar33);
                } while (pMVar13 != pMVar20);
              }
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              pMVar32 = (Mat *)((long)&pMVar32->data +
                               sVar2 * CONCAT44(local_88.elemsize._4_4_,
                                                (undefined4)local_88.elemsize));
            } while (pMVar22 != pMVar12);
          }
          in_R10D = 0;
        }
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_0033c9cb;
            (*(local_88.allocator)->_vptr_Allocator[3])();
            pMVar31 = (Mat *)local_88.data;
          }
        }
        goto LAB_0033c9de;
      }
      if ((reduce_d && (bVar8 == 0 && !reduce_h)) && cVar30 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          Mat::create(b,uVar10,uVar11,sVar2,pAVar3);
        }
        else {
          Mat::create(b,uVar10,uVar11,1,1,sVar2,pAVar3);
        }
        local_88.cstep = 0;
        local_88.data = (Mat *)0x0;
        local_88.refcount._0_4_ = 0;
        local_88.refcount._4_4_ = 0;
        local_88.elemsize._0_4_ = 0;
        local_88.elemsize._4_4_ = 0;
        local_88.elempack = 0;
        local_88.allocator = (Allocator *)0x0;
        local_88.dims = 0;
        local_88.w = 0;
        local_88.h = 0;
        local_88.d = 0;
        local_88.c = 0;
        pMVar31 = (Mat *)(ulong)uVar10;
        Mat::create(&local_88,uVar10,uVar11,uVar28,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
        sVar2 = local_88.cstep;
        pMVar20 = (Mat *)local_88.data;
        in_R10D = -100;
        if (((Mat *)local_88.data != (Mat *)0x0) &&
           (pMVar31 = (Mat *)local_88.cstep, local_88.cstep * (long)local_88.c != 0)) {
          uVar43 = (int)local_88.cstep * local_88.c;
          if (0 < (int)uVar43) {
            pMVar31 = (Mat *)0x0;
            memset(local_88.data,0,(ulong)uVar43 << 2);
          }
          if (0 < (int)uVar28) {
            pvVar21 = a->data;
            sVar33 = a->elemsize;
            sVar36 = a->cstep;
            pMVar31 = (Mat *)(lVar19 * 4);
            pMVar34 = (Mat *)0x0;
            pMVar32 = pMVar20;
            do {
              if (0 < (int)uVar35) {
                pbVar40 = (bool *)(sVar33 * sVar36 * (long)pMVar34 + (long)pvVar21);
                uVar43 = 0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar15 = (Mat *)0x0;
                    pMVar13 = pMVar32;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar14 = (Mat *)0x0;
                        do {
                          *(float *)((long)&pMVar13->data + (long)pMVar14 * 4) =
                               ABS(*(float *)(pbVar40 + (long)pMVar14 * 4)) +
                               *(float *)((long)&pMVar13->data + (long)pMVar14 * 4);
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                        } while (pMVar22 != pMVar14);
                      }
                      pbVar40 = (bool *)((long)&pMVar31->data + (long)pbVar40);
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      pMVar13 = (Mat *)((long)&pMVar13->data +
                                       (long)local_88.w *
                                       CONCAT44(local_88.elemsize._4_4_,
                                                (undefined4)local_88.elemsize));
                    } while (pMVar15 != pMVar25);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 != uVar35);
              }
              pMVar34 = (Mat *)((long)&pMVar34->data + 1);
              pMVar32 = (Mat *)((long)&pMVar32->data +
                               CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                               sVar2);
            } while (pMVar34 != pMVar12);
          }
          uVar35 = b->c * (int)b->cstep;
          if (0 < (int)uVar35) {
            pMVar31 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar35 << 2);
          }
          if (0 < (int)uVar28) {
            pvVar21 = b->data;
            iVar27 = b->w;
            sVar33 = b->elemsize;
            pMVar31 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar34 = (Mat *)0x0;
                pvVar39 = pvVar21;
                pMVar32 = pMVar20;
                do {
                  if (0 < (int)uVar10) {
                    pMVar13 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar39 + (long)pMVar13 * 4) =
                           *(float *)((long)&pMVar32->data + (long)pMVar13 * 4) +
                           *(float *)((long)pvVar39 + (long)pMVar13 * 4);
                      pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                    } while (pMVar22 != pMVar13);
                  }
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                  pMVar32 = (Mat *)((long)&pMVar32->data +
                                   (long)local_88.w *
                                   CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize));
                  pvVar39 = (void *)((long)pvVar39 + (long)iVar27 * sVar33);
                } while (pMVar34 != pMVar25);
              }
              pMVar31 = (Mat *)((long)&pMVar31->data + 1);
              pMVar20 = (Mat *)((long)&pMVar20->data +
                               sVar2 * CONCAT44(local_88.elemsize._4_4_,
                                                (undefined4)local_88.elemsize));
            } while (pMVar31 != pMVar12);
          }
          in_R10D = 0;
        }
        piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_88.allocator == (Allocator *)0x0) goto LAB_0033c9cb;
            (*(local_88.allocator)->_vptr_Allocator[3])();
            pMVar31 = (Mat *)local_88.data;
          }
        }
        goto LAB_0033c9de;
      }
      if (((bVar24 == 0 && !reduce_h) && reduce_d) && cVar9 == '\0') {
        pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
        if (_post_process == 0) {
          pMVar31 = (Mat *)(ulong)uVar11;
          Mat::create(b,uVar11,uVar28,sVar2,pAVar3);
        }
        else {
          pMVar31 = (Mat *)0x1;
          Mat::create(b,1,uVar11,1,uVar28,sVar2,pAVar3);
        }
        pMVar32 = pMVar31;
        if ((int)uVar28 < 1) goto LAB_0033badf;
        sVar2 = a->cstep;
        if (_post_process == 0) {
          sVar33 = (size_t)b->w;
        }
        else {
          sVar33 = b->cstep;
        }
        sVar36 = a->elemsize;
        pvVar21 = a->data;
        pvVar39 = b->data;
        sVar4 = b->elemsize;
        pMVar20 = (Mat *)0x0;
        do {
          pvVar17 = (void *)(sVar33 * sVar4 * (long)pMVar20 + (long)pvVar39);
          if (0 < (int)uVar11) {
            pMVar31 = (Mat *)0x0;
            memset(pvVar17,0,(long)pMVar25 * 4);
          }
          if (0 < (int)uVar35) {
            pvVar26 = (void *)(sVar2 * sVar36 * (long)pMVar20 + (long)pvVar21);
            uVar28 = 0;
            do {
              if (0 < (int)uVar11) {
                pMVar32 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    fVar46 = *(float *)((long)pvVar17 + (long)pMVar32 * 4);
                    pMVar31 = (Mat *)0x0;
                    do {
                      fVar46 = fVar46 + ABS(*(float *)((long)pvVar26 + (long)pMVar31 * 4));
                      *(float *)((long)pvVar17 + (long)pMVar32 * 4) = fVar46;
                      pMVar31 = (Mat *)((long)&pMVar31->data + 1);
                    } while (pMVar22 != pMVar31);
                  }
                  pvVar26 = (void *)((long)pvVar26 + lVar19 * 4);
                  pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                } while (pMVar32 != pMVar25);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != uVar35);
          }
          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
          bVar7 = false;
          in_R10D = 0;
        } while (pMVar20 != pMVar12);
      }
      else {
        pMVar31 = pMVar22;
        if (((reduce_h && bVar8 == 0) && !reduce_d) && cVar30 == '\0') {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar10,uVar35,sVar2,pAVar3);
          }
          else {
            Mat::create(b,uVar10,1,uVar35,1,sVar2,pAVar3);
          }
          local_88.cstep = 0;
          local_88.data = (Mat *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.allocator = (Allocator *)0x0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.d = 0;
          local_88.c = 0;
          Mat::create(&local_88,uVar10,uVar35,uVar28,sVar2,
                      *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 0x10));
          sVar2 = local_88.cstep;
          pMVar25 = (Mat *)local_88.data;
          in_R10D = -100;
          if (((Mat *)local_88.data != (Mat *)0x0) &&
             (pMVar31 = (Mat *)local_88.cstep, local_88.cstep * (long)local_88.c != 0)) {
            uVar43 = (int)local_88.cstep * local_88.c;
            if (0 < (int)uVar43) {
              pMVar31 = (Mat *)0x0;
              memset(local_88.data,0,(ulong)uVar43 << 2);
            }
            if (0 < (int)uVar28) {
              pvVar21 = a->data;
              sVar33 = a->elemsize;
              sVar36 = a->cstep;
              pMVar31 = (Mat *)(lVar19 * 4);
              pMVar34 = (Mat *)0x0;
              pMVar32 = pMVar25;
              do {
                if (0 < (int)uVar35) {
                  pbVar40 = (bool *)(sVar33 * sVar36 * (long)pMVar34 + (long)pvVar21);
                  pMVar15 = (Mat *)0x0;
                  pMVar13 = pMVar32;
                  do {
                    if (0 < (int)uVar11) {
                      uVar43 = 0;
                      do {
                        if (0 < (int)uVar10) {
                          pMVar14 = (Mat *)0x0;
                          do {
                            *(float *)((long)&pMVar13->data + (long)pMVar14 * 4) =
                                 ABS(*(float *)(pbVar40 + (long)pMVar14 * 4)) +
                                 *(float *)((long)&pMVar13->data + (long)pMVar14 * 4);
                            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                          } while (pMVar22 != pMVar14);
                        }
                        pbVar40 = (bool *)((long)&pMVar31->data + (long)pbVar40);
                        uVar43 = uVar43 + 1;
                      } while (uVar43 != uVar11);
                    }
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    pMVar13 = (Mat *)((long)&pMVar13->data +
                                     (long)local_88.w *
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     );
                  } while (pMVar15 != pMVar20);
                }
                pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                pMVar32 = (Mat *)((long)&pMVar32->data +
                                 CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize) *
                                 sVar2);
              } while (pMVar34 != pMVar12);
            }
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              pMVar31 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            if (0 < (int)uVar28) {
              pvVar21 = b->data;
              iVar27 = b->w;
              sVar33 = b->elemsize;
              pMVar31 = (Mat *)0x0;
              do {
                if (0 < (int)uVar35) {
                  pMVar34 = (Mat *)0x0;
                  pvVar39 = pvVar21;
                  pMVar32 = pMVar25;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar13 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar39 + (long)pMVar13 * 4) =
                             *(float *)((long)&pMVar32->data + (long)pMVar13 * 4) +
                             *(float *)((long)pvVar39 + (long)pMVar13 * 4);
                        pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                      } while (pMVar22 != pMVar13);
                    }
                    pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                    pMVar32 = (Mat *)((long)&pMVar32->data +
                                     (long)local_88.w *
                                     CONCAT44(local_88.elemsize._4_4_,(undefined4)local_88.elemsize)
                                     );
                    pvVar39 = (void *)((long)pvVar39 + (long)iVar27 * sVar33);
                  } while (pMVar34 != pMVar20);
                }
                pMVar31 = (Mat *)((long)&pMVar31->data + 1);
                pMVar25 = (Mat *)((long)&pMVar25->data +
                                 sVar2 * CONCAT44(local_88.elemsize._4_4_,
                                                  (undefined4)local_88.elemsize));
              } while (pMVar31 != pMVar12);
            }
            in_R10D = 0;
          }
          piVar6 = (int *)CONCAT44(local_88.refcount._4_4_,local_88.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_88.allocator == (Allocator *)0x0) {
                pMVar31 = (Mat *)local_88.data;
                if ((Mat *)local_88.data != (Mat *)0x0) {
                  free(local_88.data);
                  pMVar31 = (Mat *)local_88.data;
                }
              }
              else {
                (*(local_88.allocator)->_vptr_Allocator[3])();
                pMVar31 = (Mat *)local_88.data;
              }
            }
          }
          local_88.cstep = 0;
          local_88.data = (void *)0x0;
          local_88.refcount._0_4_ = 0;
          local_88.refcount._4_4_ = 0;
          local_88.elemsize._0_4_ = 0;
          local_88.elemsize._4_4_ = 0;
          local_88.elempack = 0;
          local_88.dims = 0;
          local_88.w = 0;
          local_88.h = 0;
          local_88.d = 0;
          local_88.c = 0;
LAB_0033d5bf:
          bVar7 = false;
        }
        else if (((reduce_h && bVar8 == 0) && reduce_d) && cVar9 == '\0') {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar10,uVar28,sVar2,pAVar3);
          }
          else {
            pMVar31 = (Mat *)(ulong)uVar10;
            Mat::create(b,uVar10,1,1,uVar28,sVar2,pAVar3);
          }
          if ((int)uVar28 < 1) {
LAB_0033d5b5:
            in_R10D = 0;
            goto LAB_0033d5bf;
          }
          sVar2 = a->cstep;
          if (_post_process == 0) {
            sVar33 = (size_t)b->w;
          }
          else {
            sVar33 = b->cstep;
          }
          pvVar21 = a->data;
          sVar36 = a->elemsize;
          pvVar39 = b->data;
          lVar42 = sVar33 * b->elemsize;
          pMVar20 = (Mat *)0x0;
          pvVar17 = pvVar39;
          do {
            if (0 < (int)uVar10) {
              pMVar31 = (Mat *)0x0;
              memset((void *)(lVar42 * (long)pMVar20 + (long)pvVar39),0,(long)pMVar22 * 4);
            }
            if (0 < (int)uVar35) {
              pvVar26 = (void *)(sVar2 * sVar36 * (long)pMVar20 + (long)pvVar21);
              uVar28 = 0;
              do {
                if (0 < (int)uVar11) {
                  uVar43 = 0;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar31 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar17 + (long)pMVar31 * 4) =
                             ABS(*(float *)((long)pvVar26 + (long)pMVar31 * 4)) +
                             *(float *)((long)pvVar17 + (long)pMVar31 * 4);
                        pMVar31 = (Mat *)((long)&pMVar31->data + 1);
                      } while (pMVar22 != pMVar31);
                    }
                    pvVar26 = (void *)((long)pvVar26 + lVar19 * 4);
                    uVar43 = uVar43 + 1;
                  } while (uVar43 != uVar11);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar35);
            }
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar17 = (void *)((long)pvVar17 + lVar42);
            bVar7 = false;
            in_R10D = 0;
          } while (pMVar20 != pMVar12);
        }
        else if (((bVar24 == 0 && !reduce_h) && !reduce_d) && cVar9 == '\0') {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            pMVar31 = (Mat *)(ulong)uVar11;
            Mat::create(b,uVar11,uVar35,uVar28,sVar2,pAVar3);
          }
          else {
            pMVar31 = (Mat *)0x1;
            Mat::create(b,1,uVar11,uVar35,uVar28,sVar2,pAVar3);
          }
          if ((int)uVar28 < 1) goto LAB_0033d5b5;
          pvVar21 = a->data;
          sVar2 = a->elemsize;
          pMVar31 = (Mat *)(b->elemsize * b->cstep);
          pvVar39 = b->data;
          sVar33 = a->cstep;
          pMVar20 = (Mat *)0x0;
          do {
            if (0 < (int)(uVar11 * uVar35)) {
              uVar41 = 0;
              pvVar17 = pvVar21;
              do {
                fVar46 = 0.0;
                if (0 < (int)uVar10) {
                  pMVar25 = (Mat *)0x0;
                  do {
                    fVar46 = fVar46 + ABS(*(float *)((long)pvVar17 + (long)pMVar25 * 4));
                    pMVar25 = (Mat *)((long)&pMVar25->data + 1);
                  } while (pMVar22 != pMVar25);
                }
                *(float *)((long)pvVar39 + uVar41 * 4 + (long)pMVar31 * (long)pMVar20) = fVar46;
                uVar41 = uVar41 + 1;
                pvVar17 = (void *)((long)pvVar17 + lVar19 * 4);
              } while (uVar41 != uVar11 * uVar35);
            }
            pMVar20 = (Mat *)((long)&pMVar20->data + 1);
            pvVar21 = (void *)((long)pvVar21 + sVar2 * sVar33);
            bVar7 = false;
            in_R10D = 0;
          } while (pMVar20 != pMVar12);
        }
        else if (((bVar8 == 0 && !reduce_h) && !reduce_d) && cVar30 == '\0') {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar10,uVar11,uVar35,sVar2,pAVar3);
          }
          else {
            pMVar31 = (Mat *)(ulong)uVar10;
            Mat::create(b,uVar10,uVar11,uVar35,1,sVar2,pAVar3);
          }
          uVar43 = b->c * (int)b->cstep;
          if (0 < (int)uVar43) {
            pMVar31 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar43 << 2);
          }
          if ((int)uVar28 < 1) goto LAB_0033d5b5;
          sVar2 = a->elemsize;
          sVar33 = a->cstep;
          pvVar21 = a->data;
          pMVar31 = (Mat *)(lVar19 * 4);
          pMVar32 = (Mat *)0x0;
          do {
            if (0 < (int)uVar35) {
              iVar27 = b->w;
              if (_post_process == 0) {
                sVar36 = b->cstep;
              }
              else {
                sVar36 = (long)b->h * (long)iVar27;
              }
              pbVar40 = (bool *)(sVar2 * sVar33 * (long)pMVar32 + (long)pvVar21);
              pvVar39 = b->data;
              sVar4 = b->elemsize;
              pMVar34 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  pMVar13 = (Mat *)0x0;
                  pvVar17 = pvVar39;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar15 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar17 + (long)pMVar15 * 4) =
                             ABS(*(float *)(pbVar40 + (long)pMVar15 * 4)) +
                             *(float *)((long)pvVar17 + (long)pMVar15 * 4);
                        pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                      } while (pMVar22 != pMVar15);
                    }
                    pbVar40 = (bool *)((long)&pMVar31->data + (long)pbVar40);
                    pMVar13 = (Mat *)((long)&pMVar13->data + 1);
                    pvVar17 = (void *)((long)pvVar17 + (long)iVar27 * sVar4);
                  } while (pMVar13 != pMVar25);
                }
                pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                pvVar39 = (void *)((long)pvVar39 + sVar36 * sVar4);
              } while (pMVar34 != pMVar20);
            }
            pMVar32 = (Mat *)((long)&pMVar32->data + 1);
            bVar7 = false;
            in_R10D = 0;
          } while (pMVar32 != pMVar12);
        }
        else if (((reduce_h && bVar8 == 0) && !reduce_d) && cVar9 == '\0') {
          pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
          if (_post_process == 0) {
            Mat::create(b,uVar10,uVar35,uVar28,sVar2,pAVar3);
          }
          else {
            pMVar31 = (Mat *)(ulong)uVar10;
            Mat::create(b,uVar10,1,uVar35,uVar28,sVar2,pAVar3);
          }
          if ((int)uVar28 < 1) goto LAB_0033d5b5;
          pvVar21 = a->data;
          sVar2 = a->elemsize;
          sVar33 = a->cstep;
          iVar27 = b->w;
          pvVar39 = b->data;
          uVar41 = b->elemsize;
          pvVar17 = (void *)(b->cstep * uVar41);
          pMVar31 = (Mat *)((long)b->h * (long)iVar27);
          pMVar25 = (Mat *)0x0;
          iVar1 = (int)((uVar41 * (long)pMVar31 + 0xf & 0xfffffffffffffff0) / uVar41);
          if (b->dims == 4) {
            iVar1 = (int)pMVar31;
          }
          uVar28 = iVar1 * b->d;
          local_40 = (ulong)uVar28 * 4;
          pvVar26 = pvVar39;
          local_38 = pvVar17;
          do {
            if (0 < (int)uVar28) {
              pMVar31 = (Mat *)0x0;
              memset((void *)((long)pvVar17 * (long)pMVar25 + (long)pvVar39),0,local_40);
              pvVar17 = local_38;
            }
            if (0 < (int)uVar35) {
              pvVar16 = (void *)(sVar2 * sVar33 * (long)pMVar25 + (long)pvVar21);
              pMVar32 = (Mat *)0x0;
              pvVar23 = pvVar26;
              do {
                if (0 < (int)uVar11) {
                  pMVar31 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      pMVar34 = (Mat *)0x0;
                      do {
                        *(float *)((long)pvVar23 + (long)pMVar34 * 4) =
                             ABS(*(float *)((long)pvVar16 + (long)pMVar34 * 4)) +
                             *(float *)((long)pvVar23 + (long)pMVar34 * 4);
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1);
                      } while (pMVar22 != pMVar34);
                    }
                    pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar10 * 4);
                    uVar43 = (int)pMVar31 + 1;
                    pMVar31 = (Mat *)(ulong)uVar43;
                  } while (uVar43 != uVar11);
                }
                pMVar32 = (Mat *)((long)&pMVar32->data + 1);
                pvVar23 = (void *)((long)pvVar23 + uVar41 * (long)iVar27);
              } while (pMVar32 != pMVar20);
            }
            pMVar25 = (Mat *)((long)&pMVar25->data + 1);
            pvVar26 = (void *)((long)pvVar26 + (long)pvVar17);
            bVar7 = false;
            in_R10D = 0;
          } while (pMVar25 != pMVar12);
        }
        else {
          bVar7 = true;
          pMVar31 = pMVar32;
          if ((reduce_d && (bVar8 == 0 && !reduce_h)) && cVar9 == '\0') {
            pAVar3 = *(Allocator **)(CONCAT44(in_stack_00000014,keepdims) + 8);
            if (_post_process == 0) {
              pMVar31 = pMVar22;
              Mat::create(b,uVar10,uVar11,uVar28,sVar2,pAVar3);
            }
            else {
              pMVar31 = pMVar22;
              Mat::create(b,uVar10,uVar11,1,uVar28,sVar2,pAVar3);
            }
            if ((int)uVar28 < 1) goto LAB_0033d5b5;
            pvVar21 = a->data;
            sVar2 = a->elemsize;
            sVar33 = a->cstep;
            iVar27 = b->w;
            pvVar39 = b->data;
            uVar41 = b->elemsize;
            lVar19 = b->cstep * uVar41;
            pMVar31 = (Mat *)((long)b->h * (long)iVar27);
            local_a8 = (Mat *)0x0;
            iVar1 = (int)((uVar41 * (long)pMVar31 + 0xf & 0xfffffffffffffff0) / uVar41);
            if (b->dims == 4) {
              iVar1 = (int)pMVar31;
            }
            uVar28 = iVar1 * b->d;
            local_40 = (ulong)uVar28 * 4;
            local_38 = pvVar39;
            do {
              if (0 < (int)uVar28) {
                pMVar31 = (Mat *)0x0;
                memset((void *)(lVar19 * (long)local_a8 + (long)local_38),0,local_40);
              }
              if (0 < (int)uVar35) {
                pvVar17 = (void *)(sVar2 * sVar33 * (long)local_a8 + (long)pvVar21);
                uVar43 = 0;
                do {
                  if (0 < (int)uVar11) {
                    pMVar31 = (Mat *)0x0;
                    pvVar26 = pvVar39;
                    do {
                      if (0 < (int)uVar10) {
                        pMVar20 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar26 + (long)pMVar20 * 4) =
                               ABS(*(float *)((long)pvVar17 + (long)pMVar20 * 4)) +
                               *(float *)((long)pvVar26 + (long)pMVar20 * 4);
                          pMVar20 = (Mat *)((long)&pMVar20->data + 1);
                        } while (pMVar22 != pMVar20);
                      }
                      pvVar17 = (void *)((long)pvVar17 + (long)(int)uVar10 * 4);
                      pMVar31 = (Mat *)((long)&pMVar31->data + 1);
                      pvVar26 = (void *)((long)pvVar26 + uVar41 * (long)iVar27);
                    } while (pMVar31 != pMVar25);
                  }
                  uVar43 = uVar43 + 1;
                } while (uVar43 != uVar35);
              }
              local_a8 = (Mat *)((long)&local_a8->data + 1);
              pvVar39 = (void *)((long)pvVar39 + lVar19);
              bVar7 = false;
              in_R10D = 0;
            } while (local_a8 != pMVar12);
          }
        }
      }
    }
LAB_0033ca05:
    if (!bVar7) goto LAB_0033ca16;
  }
  in_R10D = 0;
LAB_0033ca16:
  iVar27 = -100;
  if (in_R10D == 0) {
    iVar27 = 0;
    if (1.1920929e-07 < ABS(v0 + -1.0)) {
      reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar31);
      iVar27 = 0;
    }
  }
  return iVar27;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_d, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_d, reduce_c, keepdims, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabsf(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }

    return 0;
}